

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzline.cpp
# Opt level: O2

void pztopology::TPZLine::TShape<double>
               (TPZVec<double> *loc,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double *pdVar2;
  
  dVar1 = *loc->fStore;
  pdVar2 = TPZFMatrix<double>::operator()(phi,0,0);
  *pdVar2 = (1.0 - dVar1) * 0.5;
  pdVar2 = TPZFMatrix<double>::operator()(phi,1,0);
  *pdVar2 = (dVar1 + 1.0) * 0.5;
  pdVar2 = TPZFMatrix<double>::operator()(dphi,0,0);
  *pdVar2 = -0.5;
  pdVar2 = TPZFMatrix<double>::operator()(dphi,0,1);
  *pdVar2 = 0.5;
  return;
}

Assistant:

inline void TPZLine::TShape(const TPZVec<T> &loc,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
        T x = loc[0];
        phi(0,0) = (1.0-x)/2.;
        phi(1,0) = (1.0+x)/2.;
        dphi(0,0) = -0.5;
        dphi(0,1) = 0.5;
    }